

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econf_error.c
# Opt level: O0

char * econf_errString(econf_err error)

{
  char *unknown;
  char *pcStack_10;
  econf_err error_local;
  
  if (error < (ECONF_VALUE_CONVERSION_ERROR|ECONF_ERROR)) {
    pcStack_10 = messages[error];
  }
  else {
    snprintf(econf_errString::buffer,0x400,"Unknown libeconf error %i",(ulong)error);
    pcStack_10 = econf_errString::buffer;
  }
  return pcStack_10;
}

Assistant:

const char *
econf_errString (const econf_err error)
{
  if (error >= sizeof(messages)/sizeof(messages[0]))
    {
      static char buffer[1024]; /* should always be big enough, else truncate */
      const char *unknown = "Unknown libeconf error %i";

      snprintf (buffer, sizeof (buffer), unknown, error);

      return buffer;
    }
  else
    return messages[error];
}